

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O2

bool EV_DoCeiling(ECeiling type,line_t_conflict *line,int tag,double speed,double speed2,
                 double height,int crush,int silent,int change,ECrushMode hexencrush)

{
  sector_t_conflict *sec;
  bool bVar1;
  uint uVar2;
  bool bVar3;
  FSectorTagIterator it;
  
  if (tag == 0) {
    if ((line == (line_t_conflict *)0x0) ||
       (sec = line->backsector, sec == (sector_t_conflict *)0x0)) {
      bVar3 = false;
    }
    else {
      uVar2 = (uint)(((long)sec - (long)sectors) / 0x218) | 0x1000000;
      P_ActivateInStasisCeiling(uVar2);
      bVar3 = P_CreateCeiling((sector_t *)sec,type,line,uVar2,speed,speed2,height,crush,silent,
                              change,hexencrush);
    }
  }
  else {
    if (type == ceilCrushAndRaise) {
      P_ActivateInStasisCeiling(tag);
    }
    it.start = tagManager.TagHashFirst[tag & 0xff];
    bVar3 = false;
    it.searchtag = tag;
    while (uVar2 = FSectorTagIterator::Next(&it), -1 < (int)uVar2) {
      bVar1 = P_CreateCeiling((sector_t *)(sectors + uVar2),type,line,tag,speed,speed2,height,crush,
                              silent,change,hexencrush);
      bVar3 = (bool)(bVar3 | bVar1);
    }
  }
  return bVar3;
}

Assistant:

bool EV_DoCeiling (DCeiling::ECeiling type, line_t *line,
				   int tag, double speed, double speed2, double height,
				   int crush, int silent, int change, DCeiling::ECrushMode hexencrush)
{
	int 		secnum;
	bool 		rtn;
	sector_t*	sec;
		
	rtn = false;

	// check if a manual trigger, if so do just the sector on the backside
	if (tag == 0)
	{
		if (!line || !(sec = line->backsector))
			return rtn;
		secnum = (int)(sec-sectors);
		// [RH] Hack to let manual crushers be retriggerable, too
		tag ^= secnum | 0x1000000;
		P_ActivateInStasisCeiling (tag);
		return P_CreateCeiling(sec, type, line, tag, speed, speed2, height, crush, silent, change, hexencrush);
	}
	
	//	Reactivate in-stasis ceilings...for certain types.
	// This restarts a crusher after it has been stopped
	if (type == DCeiling::ceilCrushAndRaise)
	{
		P_ActivateInStasisCeiling (tag);
	}

	// affects all sectors with the same tag as the linedef
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		rtn |= P_CreateCeiling(&sectors[secnum], type, line, tag, speed, speed2, height, crush, silent, change, hexencrush);
	}
	return rtn;
}